

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_compress_open(char *filename,int rwmode,int *hdl)

{
  size_t sVar1;
  char *filename_00;
  long lVar2;
  int *in_RDX;
  int in_ESI;
  char *ptr;
  uint modulosize;
  LONGLONG llsize;
  size_t filesize;
  size_t finalsize;
  uchar buffer [4];
  int estimated;
  int status;
  FILE *diskfile;
  FILE **in_stack_00000428;
  int in_stack_00000434;
  char *in_stack_00000438;
  int *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  char *pcVar3;
  int hdl_00;
  FILE *in_stack_ffffffffffffffb8;
  short local_34;
  undefined1 local_32;
  undefined1 local_31;
  int local_30;
  int local_2c;
  FILE *local_28;
  int *local_20;
  int local_4;
  
  local_30 = 1;
  pcVar3 = (char *)0x0;
  if (in_ESI == 0) {
    local_20 = in_RDX;
    local_2c = file_openfile(in_stack_00000438,in_stack_00000434,in_stack_00000428);
    if (local_2c == 0) {
      sVar1 = fread(&local_34,1,2,local_28);
      hdl_00 = (int)((ulong)pcVar3 >> 0x20);
      if (sVar1 == 2) {
        if (local_34 == -0x74e1) {
          fseek(local_28,0,2);
          in_stack_ffffffffffffffb8 = (FILE *)ftell(local_28);
          fseek(local_28,-4,1);
          fread(&local_34,1,4,local_28);
          in_stack_ffffffffffffffac = CONCAT13(local_31,CONCAT12(local_32,local_34));
          filename_00 = (char *)(ulong)in_stack_ffffffffffffffac;
          if ((FILE *)0x2710 < in_stack_ffffffffffffffb8) {
            for (; pcVar3 = filename_00, (long)filename_00 < (long)in_stack_ffffffffffffffb8;
                filename_00 = filename_00 + 0x100000000) {
            }
          }
          hdl_00 = (int)((ulong)pcVar3 >> 0x20);
          local_30 = 0;
        }
        else if (local_34 == 0x4b50) {
          fseek(local_28,0x16,0);
          fread(&local_34,1,4,local_28);
          in_stack_ffffffffffffffac = CONCAT13(local_31,CONCAT12(local_32,local_34));
          filename_00 = (char *)(ulong)in_stack_ffffffffffffffac;
          local_30 = 0;
        }
        else {
          if (((local_34 != 0x1e1f) && (local_34 != -0x62e1)) && (local_34 != -0x5fe1)) {
            fclose(local_28);
            return 1;
          }
          filename_00 = (char *)0x0;
        }
        if (filename_00 == (char *)0x0) {
          fseek(local_28,0,2);
          lVar2 = ftell(local_28);
          filename_00 = (char *)(lVar2 * 3);
        }
        fseek(local_28,0,0);
        local_2c = mem_createmem(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                 in_stack_ffffffffffffffa0);
        if ((local_2c != 0) && (local_30 != 0)) {
          filename_00 = (char *)((ulong)filename_00 / 3);
          local_2c = mem_createmem(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                   in_stack_ffffffffffffffa0);
        }
        if (local_2c == 0) {
          local_2c = mem_uncompress2mem(filename_00,in_stack_ffffffffffffffb8,hdl_00);
          fclose(local_28);
          if (local_2c == 0) {
            if (memTable[*local_20].fitsfilesize + 0x100U < *memTable[*local_20].memsizeptr) {
              pcVar3 = (char *)realloc(*memTable[*local_20].memaddrptr,
                                       memTable[*local_20].fitsfilesize);
              if (pcVar3 == (char *)0x0) {
                ffpmsg((char *)0x12b215);
                return 0x71;
              }
              *memTable[*local_20].memaddrptr = pcVar3;
              *memTable[*local_20].memsizeptr = memTable[*local_20].fitsfilesize;
            }
            local_4 = 0;
          }
          else {
            mem_close_free(0);
            ffpmsg((char *)0x12b16d);
            local_4 = local_2c;
          }
        }
        else {
          fclose(local_28);
          ffpmsg((char *)0x12b11d);
          local_4 = local_2c;
        }
      }
      else {
        fclose(local_28);
        local_4 = 0x6c;
      }
    }
    else {
      ffpmsg((char *)0x12ae15);
      ffpmsg((char *)0x12ae1f);
      local_4 = local_2c;
    }
  }
  else {
    ffpmsg((char *)0x12add6);
    ffpmsg((char *)0x12ade0);
    local_4 = 0x70;
  }
  return local_4;
}

Assistant:

int mem_compress_open(char *filename, int rwmode, int *hdl)
/*
  This routine opens the compressed diskfile and creates an empty memory
  buffer with an appropriate size, then calls mem_uncompress2mem.
*/
{
    FILE *diskfile;
    int status, estimated = 1;
    unsigned char buffer[4];
    size_t finalsize, filesize;
    LONGLONG llsize = 0;
    unsigned int modulosize;
    char *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open compressed file with WRITE access (mem_compress_open)");
        ffpmsg(filename);
        return(READONLY_FILE);
    }

    /* open the compressed disk file */
    status = file_openfile(filename, READONLY, &diskfile);
    if (status)
    {
        ffpmsg("failed to open compressed disk file (compress_open)");
        ffpmsg(filename);
        return(status);
    }

    if (fread(buffer, 1, 2, diskfile) != 2)  /* read 2 bytes */
    {
        fclose(diskfile);
        return(READ_ERROR);
    }

    if (memcmp(buffer, "\037\213", 2) == 0)  /* GZIP */
    {
        /* the uncompressed file size is give at the end */
        /* of the file in the ISIZE field  (modulo 2^32) */

        fseek(diskfile, 0, 2);            /* move to end of file */
        filesize = ftell(diskfile);       /* position = size of file */
        fseek(diskfile, -4L, 1);          /* move back 4 bytes */
        fread(buffer, 1, 4L, diskfile);   /* read 4 bytes */

        /* have to worry about integer byte order */
	modulosize  = buffer[0];
	modulosize |= buffer[1] << 8;
	modulosize |= buffer[2] << 16;
	modulosize |= buffer[3] << 24;

/*
  the field ISIZE in the gzipped file header only stores 4 bytes and contains
  the uncompressed file size modulo 2^32.  If the uncompressed file size
  is less than the compressed file size (filesize), then one probably needs to
  add 2^32 = 4294967296 to the uncompressed file size, assuming that the gzip
  produces a compressed file that is smaller than the original file.

  But one must allow for the case of very small files, where the
  gzipped file may actually be larger then the original uncompressed file.
  Therefore, only perform the modulo 2^32 correction test if the compressed 
  file is greater than 10,000 bytes in size.  (Note: this threhold would
  fail only if the original file was greater than 2^32 bytes in size AND gzip 
  was able to compress it by more than a factor of 400,000 (!) which seems
  highly unlikely.)
  
  Also, obviously, this 2^32 modulo correction cannot be performed if the
  finalsize variable is only 32-bits long.  Typically, the 'size_t' integer
  type must be 8 bytes or larger in size to support data files that are 
  greater than 2 GB (2^31 bytes) in size.  
*/
        finalsize = modulosize;

        if (sizeof(size_t) > 4 && filesize > 10000) {
	    llsize = (LONGLONG) finalsize;  
	    /* use LONGLONG variable to suppress compiler warning */
            while (llsize <  (LONGLONG) filesize) llsize += 4294967296;

            finalsize = (size_t) llsize;
        }

        estimated = 0;  /* file size is known, not estimated */
    }
    else if (memcmp(buffer, "\120\113", 2) == 0)   /* PKZIP */
    {
        /* the uncompressed file size is give at byte 22 the file */

        fseek(diskfile, 22L, 0);            /* move to byte 22 */
        fread(buffer, 1, 4L, diskfile);   /* read 4 bytes */

        /* have to worry about integer byte order */
	modulosize  = buffer[0];
	modulosize |= buffer[1] << 8;
	modulosize |= buffer[2] << 16;
	modulosize |= buffer[3] << 24;
        finalsize = modulosize;

        estimated = 0;  /* file size is known, not estimated */
    }
    else if (memcmp(buffer, "\037\036", 2) == 0)  /* PACK */
        finalsize = 0;  /* for most methods we can't determine final size */
    else if (memcmp(buffer, "\037\235", 2) == 0)  /* LZW */
        finalsize = 0;  /* for most methods we can't determine final size */
    else if (memcmp(buffer, "\037\240", 2) == 0)  /* LZH */
        finalsize = 0;  /* for most methods we can't determine final size */
#if HAVE_BZIP2
    else if (memcmp(buffer, "BZ", 2) == 0)        /* BZip2 */
        finalsize = 0;  /* for most methods we can't determine final size */
#endif
    else
    {
        /* not a compressed file; this should never happen */
        fclose(diskfile);
        return(1);
    }